

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O0

SRes Lzma2Dec_DecodeToBuf
               (CLzma2Dec *p,Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,
               ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  SizeT SVar1;
  SRes SVar2;
  size_t __n;
  ELzmaStatus *in_RDX;
  void *in_RSI;
  SizeT *in_RDI;
  long *in_R8;
  SRes res;
  ELzmaFinishMode curFinishMode;
  SizeT dicPos;
  SizeT outSizeCur;
  SizeT srcSizeCur;
  SizeT inSize;
  SizeT outSize;
  long local_48;
  undefined8 local_40;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_40 = *(undefined8 *)in_RDX;
  local_48 = *in_R8;
  in_RDX[0] = LZMA_STATUS_NOT_SPECIFIED;
  in_RDX[1] = LZMA_STATUS_NOT_SPECIFIED;
  *in_R8 = 0;
  while( true ) {
    if (in_RDI[6] == in_RDI[7]) {
      in_RDI[6] = 0;
    }
    SVar1 = in_RDI[6];
    SVar2 = Lzma2Dec_DecodeToDic
                      ((CLzma2Dec *)dicPos,_res,
                       (Byte *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       (ELzmaFinishMode)((ulong)in_RSI >> 0x20),in_RDX);
    *in_R8 = local_48 + *in_R8;
    __n = in_RDI[6] - SVar1;
    memcpy(in_RSI,(void *)(in_RDI[3] + SVar1),__n);
    in_RSI = (void *)(__n + (long)in_RSI);
    local_40 = local_40 - __n;
    *(size_t *)in_RDX = __n + *(undefined8 *)in_RDX;
    if (SVar2 != 0) break;
    if ((__n == 0) || (local_48 = 0, local_40 == LZMA_STATUS_NOT_SPECIFIED)) {
      return 0;
    }
  }
  return SVar2;
}

Assistant:

SRes Lzma2Dec_DecodeToBuf(CLzma2Dec *p, Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT outSize = *destLen, inSize = *srcLen;
  *srcLen = *destLen = 0;
  for (;;)
  {
    SizeT srcSizeCur = inSize, outSizeCur, dicPos;
    ELzmaFinishMode curFinishMode;
    SRes res;
    if (p->decoder.dicPos == p->decoder.dicBufSize)
      p->decoder.dicPos = 0;
    dicPos = p->decoder.dicPos;
    if (outSize > p->decoder.dicBufSize - dicPos)
    {
      outSizeCur = p->decoder.dicBufSize;
      curFinishMode = LZMA_FINISH_ANY;
    }
    else
    {
      outSizeCur = dicPos + outSize;
      curFinishMode = finishMode;
    }

    res = Lzma2Dec_DecodeToDic(p, outSizeCur, src, &srcSizeCur, curFinishMode, status);
    src += srcSizeCur;
    inSize -= srcSizeCur;
    *srcLen += srcSizeCur;
    outSizeCur = p->decoder.dicPos - dicPos;
    memcpy(dest, p->decoder.dic + dicPos, outSizeCur);
    dest += outSizeCur;
    outSize -= outSizeCur;
    *destLen += outSizeCur;
    if (res != 0)
      return res;
    if (outSizeCur == 0 || outSize == 0)
      return SZ_OK;
  }
}